

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

RefAST __thiscall
antlr::ASTFactory::make
          (ASTFactory *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *nodes)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long lVar3;
  ASTRef *pAVar4;
  ASTRefCount<antlr::AST> *other;
  long *in_RDX;
  ulong uVar5;
  AST *pAVar6;
  RefAST tail;
  ASTRefCount<antlr::AST> local_50;
  ASTRefCount<antlr::AST> local_48;
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38;
  
  if ((long *)in_RDX[1] == (long *)*in_RDX) {
    ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)this,(AST *)0x0);
  }
  else {
    pp_Var1 = *(_func_int ***)*in_RDX;
    if (pp_Var1 != (_func_int **)0x0) {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    }
    this->_vptr_ASTFactory = pp_Var1;
    ASTRefCount<antlr::AST>::ASTRefCount(&tail,(AST *)0x0);
    if ((this->_vptr_ASTFactory != (_func_int **)0x0) &&
       (p_Var2 = *this->_vptr_ASTFactory, p_Var2 != (_func_int *)0x0)) {
      ASTRefCount<antlr::AST>::ASTRefCount(&local_50,(AST *)0x0);
      (**(code **)(*(long *)p_Var2 + 0xa0))(p_Var2,&local_50);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_50);
    }
    uVar5 = 1;
    while( true ) {
      lVar3 = *in_RDX;
      if ((ulong)(in_RDX[1] - lVar3 >> 3) <= uVar5) break;
      pAVar4 = *(ASTRef **)(lVar3 + uVar5 * 8);
      if ((pAVar4 != (ASTRef *)0x0) && (pAVar4->ptr != (AST *)0x0)) {
        if ((this->_vptr_ASTFactory == (_func_int **)0x0) ||
           (p_Var2 = *this->_vptr_ASTFactory, p_Var2 == (_func_int *)0x0)) {
          other = ASTRefCount<antlr::AST>::operator=
                            (&tail,(ASTRefCount<antlr::AST> *)(lVar3 + uVar5 * 8));
          ASTRefCount<antlr::AST>::operator=((ASTRefCount<antlr::AST> *)this,other);
        }
        else {
          if ((tail.ref == (ASTRef *)0x0) || (pAVar6 = (tail.ref)->ptr, pAVar6 == (AST *)0x0)) {
            pAVar4->count = pAVar4->count + 1;
            local_40.ref = pAVar4;
            (**(code **)(*(long *)p_Var2 + 0xa0))(p_Var2,&local_40);
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
            (**(code **)(*(long *)*this->_vptr_ASTFactory + 0x68))(&local_38);
          }
          else {
            pAVar4->count = pAVar4->count + 1;
            local_48.ref = pAVar4;
            (*pAVar6->_vptr_AST[0x15])(pAVar6,&local_48);
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_48);
            (*(tail.ref)->ptr->_vptr_AST[0xe])(&local_38);
          }
          ASTRefCount<antlr::AST>::operator=(&tail,&local_38);
          ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
        }
        if ((tail.ref != (ASTRef *)0x0) && (pAVar6 = (tail.ref)->ptr, pAVar6 != (AST *)0x0)) {
          while( true ) {
            (*pAVar6->_vptr_AST[0xe])(&local_38);
            if (local_38.ref == (ASTRef *)0x0) break;
            pAVar6 = (local_38.ref)->ptr;
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
            if (pAVar6 == (AST *)0x0) goto LAB_0014c45e;
            (*(tail.ref)->ptr->_vptr_AST[0xe])(&local_38);
            ASTRefCount<antlr::AST>::operator=(&tail,&local_38);
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
            pAVar6 = (tail.ref)->ptr;
          }
          ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
        }
      }
LAB_0014c45e:
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    ASTRefCount<antlr::AST>::~ASTRefCount(&tail);
  }
  return (RefAST)this;
}

Assistant:

RefAST ASTFactory::make(ANTLR_USE_NAMESPACE(std)vector<RefAST>& nodes)
{
	if ( nodes.size() == 0 )
		return RefAST(nullASTptr);

	RefAST root = nodes[0];
	RefAST tail = RefAST(nullASTptr);

	if( root )
		root->setFirstChild(RefAST(nullASTptr));	// don't leave any old pointers set

	// link in children;
	for( unsigned int i = 1; i < nodes.size(); i++ )
	{
		if ( nodes[i] == 0 )		// ignore null nodes
			continue;

		if ( root == 0 )			// Set the root and set it up for a flat list
			root = tail = nodes[i];
		else if ( tail == 0 )
		{
			root->setFirstChild(nodes[i]);
			tail = root->getFirstChild();
		}
		else
		{
			tail->setNextSibling(nodes[i]);
			tail = tail->getNextSibling();
		}

		if( tail )	// RK: I cannot fathom why this missing check didn't bite anyone else...
		{
			// Chase tail to last sibling
			while (tail->getNextSibling())
				tail = tail->getNextSibling();
		}
	}

	return root;
}